

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_DoubleReturnValue_Test::testBody
          (TEST_MockReturnValueTest_DoubleReturnValue_Test *this)

{
  undefined8 uVar1;
  int iVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  double dVar6;
  undefined8 uVar7;
  undefined8 extraout_XMM0_Qa;
  SimpleString local_d0;
  MockNamedValue local_c0;
  SimpleString local_70;
  SimpleString local_60;
  long *local_50;
  MockActualCall *actual_call;
  SimpleString local_28;
  undefined8 local_18;
  double expected_return_value;
  TEST_MockReturnValueTest_DoubleReturnValue_Test *this_local;
  
  local_18 = 0x401f333333333333;
  expected_return_value = (double)this;
  SimpleString::SimpleString(&local_28,"");
  pMVar3 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)&actual_call,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&actual_call);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xf8))(local_18);
  SimpleString::~SimpleString((SimpleString *)&actual_call);
  SimpleString::~SimpleString(&local_28);
  SimpleString::SimpleString(&local_60,"");
  pMVar3 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_70);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  local_50 = (long *)CONCAT44(extraout_var_00,iVar2);
  pUVar4 = UtestShell::getCurrent();
  uVar1 = local_18;
  (**(code **)(*local_50 + 0xa8))();
  dVar6 = MockNamedValue::getDoubleValue(&local_c0);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x15])
            (uVar1,dVar6,0x3fa999999999999a,pUVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x28b,pTVar5);
  MockNamedValue::~MockNamedValue(&local_c0);
  pUVar4 = UtestShell::getCurrent();
  uVar1 = local_18;
  uVar7 = (**(code **)(*local_50 + 0x130))();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x15])
            (uVar1,uVar7,0x3fa999999999999a,pUVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x28c,pTVar5);
  pUVar4 = UtestShell::getCurrent();
  uVar1 = local_18;
  SimpleString::SimpleString(&local_d0,"");
  pMVar3 = mock(&local_d0,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x1a])();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x15])
            (uVar1,extraout_XMM0_Qa,0x3fa999999999999a,pUVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x28d,pTVar5);
  SimpleString::~SimpleString(&local_d0);
  return;
}

Assistant:

TEST(MockReturnValueTest, DoubleReturnValue)
{
    double expected_return_value = 7.8;
    mock().expectOneCall("foo").andReturnValue(expected_return_value);

    MockActualCall& actual_call = mock().actualCall("foo");
    DOUBLES_EQUAL(expected_return_value, actual_call.returnValue().getDoubleValue(), 0.05);
    DOUBLES_EQUAL(expected_return_value, actual_call.returnDoubleValue(), 0.05);
    DOUBLES_EQUAL(expected_return_value, mock().doubleReturnValue(), 0.05);
}